

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2.c
# Opt level: O3

void TIME_Constant(unqlite_value *pValue,void *pUserData)

{
  tm *ptVar1;
  time_t tt;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar1 = localtime(&tStack_18);
  unqlite_value_string_format
            (pValue,"%02d:%02d:%02d",(ulong)(uint)ptVar1->tm_hour,(ulong)(uint)ptVar1->tm_min,
             (ulong)(uint)ptVar1->tm_sec);
  return;
}

Assistant:

static void TIME_Constant(unqlite_value *pValue, void *pUserData /* Unused */)
{
	struct tm *pLocal;
#if defined(_MSC_VER) || defined(__MINGW32__)
    /* errno_t err; */
    __time64_t long_time;
    struct tm newtime;
    _time64( &long_time );
    /* err = */ _localtime64_s(&newtime, &long_time);
    /* if (err != 0) return UNQLITE_INVALID; */
    pLocal = &newtime;
#else
	time_t tt;
	/* Get the current local time */
	time(&tt);
	pLocal = localtime(&tt);
#endif
	/* Expand the current time now */
	unqlite_value_string_format(pValue, "%02d:%02d:%02d", 
		pLocal->tm_hour, 
		pLocal->tm_min, 
		pLocal->tm_sec
		);
}